

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbox_core.cpp
# Opt level: O3

void __thiscall so_5::impl::mbox_core_t::mbox_core_t(mbox_core_t *this,tracer_t *tracer)

{
  _Rb_tree_header *p_Var1;
  
  atomic_refcounted_t::atomic_refcounted_t(&this->super_atomic_refcounted_t);
  p_Var1 = &(this->m_named_mboxes_dictionary)._M_t._M_impl.super__Rb_tree_header;
  this->_vptr_mbox_core_t = (_func_int **)&PTR__mbox_core_t_00285f80;
  this->m_tracer = tracer;
  (this->m_dictionary_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_dictionary_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_dictionary_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_dictionary_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_dictionary_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_named_mboxes_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_named_mboxes_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_named_mboxes_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_named_mboxes_dictionary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_named_mboxes_dictionary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_mbox_id_counter).super___atomic_base<unsigned_long_long>._M_i = 1;
  return;
}

Assistant:

mbox_core_t::mbox_core_t(
	so_5::msg_tracing::tracer_t * tracer )
	:	m_tracer{ tracer }
	,	m_mbox_id_counter{ 1 }
{
}